

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

void give_may_advance_msg(int skill)

{
  pline("You feel more confident in your %sskills.");
  nomul(0,(char *)0x0);
  return;
}

Assistant:

static void give_may_advance_msg(int skill)
{
	pline("You feel more confident in your %sskills.",
		skill == P_NONE ?
			"" :
		skill <= P_LAST_WEAPON ?
			"weapon " :
		skill <= P_LAST_SPELL ?
			"spell casting " :
		"fighting ");
	nomul(0, NULL);
}